

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

Production * new_internal_production(Grammar *g,Production *p)

{
  Production *pPVar1;
  bool bVar2;
  byte bVar3;
  size_t sVar4;
  char *__s;
  char *local_60;
  uint local_54;
  uint found;
  uint i;
  Production *ttp;
  Production *tp;
  Production *pp;
  char *name;
  int maxLen;
  char *n;
  Production *p_local;
  Grammar *g_local;
  
  if (p == (Production *)0x0) {
    local_60 = " _synthetic";
  }
  else {
    local_60 = p->name;
  }
  sVar4 = strlen(local_60);
  __s = (char *)malloc((long)((int)sVar4 + 0x15));
  if (__s == (char *)0x0) {
    d_fail("could not allocate enough memory for a new_internal_production");
    g_local = (Grammar *)0x0;
  }
  else {
    ttp = (Production *)0x0;
    bVar2 = false;
    snprintf(__s,(long)((int)sVar4 + 0x14),"%s__%d",local_60,(ulong)(g->productions).n);
    g_local = (Grammar *)new_production(g,__s);
    *(byte *)((long)&(g_local->terminals).v + 4) =
         *(byte *)((long)&(g_local->terminals).v + 4) & 0xe3 | 4;
    if (p == (Production *)0x0) {
      bVar3 = 0;
    }
    else {
      bVar3 = p->field_0x3c & 1;
    }
    *(byte *)((long)&(g_local->terminals).v + 4) =
         *(byte *)((long)&(g_local->terminals).v + 4) & 0xfe | bVar3;
    if (p != (Production *)0x0) {
      for (local_54 = 0; local_54 < (g->productions).n; local_54 = local_54 + 1) {
        if (bVar2) {
          pPVar1 = (g->productions).v[local_54];
          (g->productions).v[local_54] = ttp;
          ttp = pPVar1;
        }
        else if (p == (g->productions).v[local_54]) {
          bVar2 = true;
          ttp = (g->productions).v[local_54 + 1];
          (g->productions).v[local_54 + 1] = (Production *)g_local;
          local_54 = local_54 + 1;
        }
      }
    }
  }
  return (Production *)g_local;
}

Assistant:

Production *new_internal_production(Grammar *g, Production *p) {
  char *n = p ? p->name : " _synthetic";
  int maxLen = strlen(n) + 21;
  char *name = MALLOC(maxLen);
  if (name == NULL) {
    d_fail("could not allocate enough memory for a new_internal_production");
    return NULL;
  }
  maxLen--;
  Production *pp = NULL, *tp = NULL, *ttp;
  uint i, found = 0;
  snprintf(name, maxLen, "%s__%d", n, g->productions.n);
  pp = new_production(g, name);
  pp->internal = INTERNAL_HIDDEN;
  pp->regex = p ? p->regex : 0;
  if (p) {
    for (i = 0; i < g->productions.n; i++) {
      if (found) {
        ttp = g->productions.v[i];
        g->productions.v[i] = tp;
        tp = ttp;
      } else if (p == g->productions.v[i]) {
        found = 1;
        tp = g->productions.v[i + 1];
        g->productions.v[i + 1] = pp;
        i++;
      }
    }
  }
  return pp;
}